

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureImageIterator::TextureImageIterator
          (TextureImageIterator *this,ImageInfo *info,int levelCount)

{
  deUint32 dVar1;
  uint uVar2;
  uint uVar3;
  IVec3 *pIVar4;
  int i;
  long lVar5;
  int i_2;
  int iVar6;
  uint uVar7;
  uint uVar8;
  IVec3 size;
  
  iVar6 = 6;
  if (info->m_target != 0x8513) {
    size.m_data[2] = 0;
    if (info->m_target == 0x8c1a) {
      pIVar4 = &info->m_size;
    }
    else {
      lVar5 = 0;
      do {
        iVar6 = (info->m_size).m_data[lVar5];
        if (iVar6 < 2) {
          iVar6 = 1;
        }
        size.m_data[lVar5] = iVar6;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      pIVar4 = &size;
    }
    iVar6 = pIVar4->m_data[2];
  }
  this->m_levelImageCount = iVar6;
  dVar1 = info->m_target;
  (this->m_info).m_format = info->m_format;
  (this->m_info).m_target = dVar1;
  lVar5 = 0;
  do {
    (this->m_info).m_size.m_data[lVar5] = (info->m_size).m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  this->m_currentLevel = 0;
  dVar1 = info->m_target;
  (this->m_levelSize).m_data[2] = 0;
  (this->m_levelSize).m_data[0] = 0;
  (this->m_levelSize).m_data[1] = 0;
  if (dVar1 == 0x8c1a) {
    uVar2 = (info->m_size).m_data[0];
    uVar3 = (info->m_size).m_data[1];
    uVar7 = -(uint)(1 < (int)uVar2);
    uVar8 = -(uint)(1 < (int)uVar3);
    (this->m_levelSize).m_data[0] = ~uVar7 & 1 | uVar2 & uVar7;
    (this->m_levelSize).m_data[1] = ~uVar8 & 1 | uVar3 & uVar8;
    (this->m_levelSize).m_data[2] = (info->m_size).m_data[2];
  }
  else {
    lVar5 = 0;
    do {
      iVar6 = (info->m_size).m_data[lVar5];
      if (iVar6 < 2) {
        iVar6 = 1;
      }
      (this->m_levelSize).m_data[lVar5] = iVar6;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
  }
  this->m_currentImage = -1;
  this->m_levelCount = levelCount;
  return;
}

Assistant:

TextureImageIterator::TextureImageIterator (const ImageInfo info, int levelCount)
	: m_levelImageCount	(info.getTarget() == GL_TEXTURE_CUBE_MAP ? 6 : getLevelSize(info.getTarget(), info.getSize(), 0).z())
	, m_info			(info)
	, m_currentLevel	(0)
	, m_levelSize		(getLevelSize(info.getTarget(), info.getSize(), 0))
	, m_currentImage	(-1)
	, m_levelCount		(levelCount)
{
	DE_ASSERT(m_levelCount <= getLevelCount(info));
}